

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

bool __thiscall
VertexAttrib64Bit::GetVertexAttribTest::verifyResults
          (GetVertexAttribTest *this,GLdouble *set_values,GLuint length,GLuint index,
          char *function_name,int line_number)

{
  double dVar1;
  ulong uVar2;
  bool bVar3;
  GLenum err;
  ulong uVar4;
  GLdouble results [4];
  GLdouble local_58;
  double adStack_50 [4];
  
  adStack_50[1] = 0.0;
  adStack_50[2] = 0.0;
  local_58 = 0.0;
  adStack_50[0] = 0.0;
  (*(this->super_Base).gl.getVertexAttribLdv)(index,0x8626,&local_58);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"GetVertexAttribLdv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x477);
  bVar3 = true;
  if (length != 0) {
    dVar1 = this->m_epsilon;
    if ((local_58 <= dVar1 + *set_values) && (*set_values - dVar1 <= local_58)) {
      uVar2 = 1;
      while (uVar4 = uVar2, length != uVar4) {
        if ((dVar1 + set_values[uVar4] < adStack_50[uVar4 - 1]) ||
           (uVar2 = uVar4 + 1, adStack_50[uVar4 - 1] < set_values[uVar4] - dVar1)) break;
      }
      if (length <= uVar4) {
        return true;
      }
    }
    logError(this,set_values,&local_58,length,function_name,index,line_number);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool GetVertexAttribTest::verifyResults(const GLdouble* set_values, GLuint length, GLuint index,
										const char* function_name, int line_number) const
{
	GLdouble results[4] = { 0.0, 0.0, 0.0, 0.0 };

	gl.getVertexAttribLdv(index, GL_CURRENT_VERTEX_ATTRIB, results);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribLdv");

	if (false == compareDoubles(set_values, results, length))
	{
		logError(set_values, results, length, function_name, index, line_number);

		return false;
	}

	return true;
}